

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

QString * absoluteFilePath(QString *__return_storage_ptr__,Options *options,
                          QString *relativeFileName)

{
  pointer pQVar1;
  char cVar2;
  QString *prefix;
  QString *pQVar3;
  QString *dir;
  long in_FS_OFFSET;
  QLatin1String QVar4;
  QLatin1String QVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QArrayDataPointer<char16_t> local_88;
  undefined1 local_70 [32];
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar4.m_data = (char *)0x4;
  QVar4.m_size = (qsizetype)relativeFileName;
  cVar2 = QString::startsWith(QVar4,0x138cd2);
  if (cVar2 != '\0') {
    pQVar1 = (options->extraLibraryDirs).super__Vector_base<QString,_std::allocator<QString>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pQVar3 = (options->extraLibraryDirs).super__Vector_base<QString,_std::allocator<QString>_>.
                  _M_impl.super__Vector_impl_data._M_start; pQVar3 != pQVar1; pQVar3 = pQVar3 + 1) {
      (__return_storage_ptr__->d).size = -0x5555555555555556;
      (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QString::mid((longlong)&local_88,(longlong)relativeFileName);
      local_50.d = (Data *)local_88.size;
      local_70._24_8_ = local_88.ptr;
      local_70._16_8_ = local_88.d;
      local_70._8_2_ = L'/';
      local_88.d = (Data *)0x0;
      local_88.ptr = (char16_t *)0x0;
      local_88.size = 0;
      local_70._0_8_ = pQVar3;
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString>::convertTo<QString>
                (__return_storage_ptr__,
                 (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString> *)local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(local_70 + 0x10));
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      cVar2 = QFile::exists((QString *)__return_storage_ptr__);
      if (cVar2 != '\0') goto LAB_00116657;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
    }
  }
  pQVar1 = (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pQVar3 = (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>.
                _M_impl.super__Vector_impl_data._M_start; pQVar3 != pQVar1; pQVar3 = pQVar3 + 1) {
    (__return_storage_ptr__->d).size = -0x5555555555555556;
    (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_70._8_2_ = L'/';
    local_70._0_8_ = pQVar3;
    local_70._16_8_ = relativeFileName;
    QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
              (__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
               local_70);
    cVar2 = QFile::exists((QString *)__return_storage_ptr__);
    if (cVar2 != '\0') goto LAB_00116657;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
  }
  QVar5.m_data = (char *)0x19;
  QVar5.m_size = (qsizetype)relativeFileName;
  cVar2 = QString::endsWith(QVar5,0x138bef);
  if (cVar2 == '\0') {
    QVar6.m_data = (char *)0x4;
    QVar6.m_size = (qsizetype)relativeFileName;
    cVar2 = QString::startsWith(QVar6,0x139400);
    if (cVar2 == '\0') {
      QVar7.m_data = (char *)0x4;
      QVar7.m_size = (qsizetype)relativeFileName;
      cVar2 = QString::startsWith(QVar7,0x138cd2);
      if (cVar2 == '\0') {
        local_70._8_2_ = L'/';
        local_70._0_8_ = &options->qtInstallDirectory;
        local_70._16_8_ = relativeFileName;
        QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::
        convertTo<QString>(__return_storage_ptr__,
                           (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>
                            *)local_70);
      }
      else {
        QString::mid((longlong)&local_88,(longlong)relativeFileName);
        local_50.size = local_88.size;
        local_50.ptr = local_88.ptr;
        local_50.d = local_88.d;
        local_70._8_2_ = L'/';
        local_70._24_2_ = 0x2f;
        local_88.d = (Data *)0x0;
        local_88.ptr = (char16_t *)0x0;
        local_88.size = 0;
        local_70._0_8_ = &options->qtInstallDirectory;
        local_70._16_8_ = &options->qtLibsDirectory;
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_QString>
        ::convertTo<QString>
                  (__return_storage_ptr__,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_QString>
                    *)local_70);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      }
      goto LAB_00116657;
    }
    local_70._16_8_ = &options->qtDataDirectory;
  }
  else {
    pQVar1 = (options->extraLibraryDirs).super__Vector_base<QString,_std::allocator<QString>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pQVar3 = (options->extraLibraryDirs).super__Vector_base<QString,_std::allocator<QString>_>.
                  _M_impl.super__Vector_impl_data._M_start; pQVar3 != pQVar1; pQVar3 = pQVar3 + 1) {
      (__return_storage_ptr__->d).size = -0x5555555555555556;
      (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_70._8_2_ = L'/';
      local_70._0_8_ = pQVar3;
      local_70._16_8_ = relativeFileName;
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
                (__return_storage_ptr__,
                 (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
                 local_70);
      cVar2 = QFile::exists((QString *)__return_storage_ptr__);
      if (cVar2 != '\0') goto LAB_00116657;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
    }
    local_70._16_8_ = &options->qtLibsDirectory;
  }
  local_70._0_8_ = &options->qtInstallDirectory;
  local_70._8_2_ = L'/';
  local_70._24_2_ = 0x2f;
  local_50.d = (Data *)relativeFileName;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_const_QString_&>
  ::convertTo<QString>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_const_QString_&>
              *)local_70);
LAB_00116657:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString absoluteFilePath(const Options *options, const QString &relativeFileName)
{
    // Use extraLibraryDirs as the extra library lookup folder if it is expected to find a file in
    // any $prefix/lib folder.
    // Library directories from a build tree(extraLibraryDirs) have the higher priority.
    if (relativeFileName.startsWith("lib/"_L1)) {
        for (const auto &dir : options->extraLibraryDirs) {
            const QString path = dir + u'/' + relativeFileName.mid(sizeof("lib/") - 1);
            if (QFile::exists(path))
                return path;
        }
    }

    for (const auto &prefix : options->extraPrefixDirs) {
        const QString path = prefix + u'/' + relativeFileName;
        if (QFile::exists(path))
            return path;
    }

    if (relativeFileName.endsWith("-android-dependencies.xml"_L1)) {
        for (const auto &dir : options->extraLibraryDirs) {
            const QString path = dir + u'/' + relativeFileName;
            if (QFile::exists(path))
                return path;
        }
        return options->qtInstallDirectory + u'/' + options->qtLibsDirectory +
               u'/' + relativeFileName;
    }

    if (relativeFileName.startsWith("jar/"_L1)) {
        return options->qtInstallDirectory + u'/' + options->qtDataDirectory +
               u'/' + relativeFileName;
    }

    if (relativeFileName.startsWith("lib/"_L1)) {
        return options->qtInstallDirectory + u'/' + options->qtLibsDirectory +
               u'/' + relativeFileName.mid(sizeof("lib/") - 1);
    }
    return options->qtInstallDirectory + u'/' + relativeFileName;
}